

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

Arg * __thiscall
fmt::internal::FormatterBase::do_get_arg
          (Arg *__return_storage_ptr__,FormatterBase *this,uint arg_index,char **error)

{
  LongLong *pLVar1;
  size_t sVar2;
  
  ArgList::operator[](__return_storage_ptr__,&this->args_,arg_index);
  if (__return_storage_ptr__->type == NAMED_ARG) {
    pLVar1 = (LongLong *)(__return_storage_ptr__->super_Value).field_0.pointer;
    __return_storage_ptr__->type = *(Type *)(pLVar1 + 2);
    sVar2 = pLVar1[1];
    (__return_storage_ptr__->super_Value).field_0.long_long_value = *pLVar1;
    (__return_storage_ptr__->super_Value).field_0.string.size = sVar2;
  }
  else if (__return_storage_ptr__->type == NONE) {
    *error = "argument index out of range";
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC Arg fmt::internal::FormatterBase::do_get_arg(
    unsigned arg_index, const char *&error) {
  Arg arg = args_[arg_index];
  switch (arg.type) {
  case Arg::NONE:
    error = "argument index out of range";
    break;
  case Arg::NAMED_ARG:
    arg = *static_cast<const internal::Arg*>(arg.pointer);
  default:
    /*nothing*/;
  }
  return arg;
}